

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::Uniq::cmp<phf_string>(phf_string_t *a,phf_string_t *b)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong __n;
  uint uVar4;
  
  uVar1 = a->n;
  uVar2 = b->n;
  __n = uVar2;
  if (uVar1 < uVar2) {
    __n = uVar1;
  }
  uVar4 = 0xffffffff;
  if (uVar1 <= uVar2) {
    uVar4 = (uint)(uVar1 < uVar2);
  }
  uVar3 = memcmp(a->p,b->p,__n);
  if (uVar3 == 0) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

int cmp(const phf_string_t *a, const phf_string_t *b) {
			int cmp;
			if ((cmp = memcmp(a->p, b->p, PHF_MIN(a->n, b->n))))
				return cmp;
			if (a->n > b->n)
				return -1;
			if (a->n < b->n)
				return 1;
			return 0;
		}